

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

avector<Vec3fa> * __thiscall
embree::XMLLoader::loadVec3faArray
          (avector<Vec3fa> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Vec3fa VVar2;
  int iVar3;
  Vec3fa *pVVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar5;
  size_t *psVar6;
  runtime_error *this_01;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  size_t *psVar12;
  ulong uVar13;
  float fVar14;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> temp;
  string local_98;
  string local_78;
  float local_58;
  float local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (Vec3fa *)0x0;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ofs","");
    XML::parm(&local_98,this_00,&local_78);
    iVar3 = std::__cxx11::string::compare((char *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (iVar3 == 0) {
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fa *)0x0;
      psVar12 = &__return_storage_ptr__->size_active;
      lVar10 = (long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar9 = lVar10 * -0x71c71c71c71c71c7;
      if (0x5555555555555555 < (ulong)(lVar10 * -0x7b425ed097b425ed)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_78,&xml->ptr->loc);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_98._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_98._M_dataplus._M_p == psVar8) {
          local_98.field_2._M_allocated_capacity = *psVar8;
          local_98.field_2._8_8_ = plVar7[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar8;
        }
        local_98._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_98);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar13 = uVar9 / 3;
      psVar6 = psVar12;
      if (2 < uVar9) {
        pVVar4 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
        __return_storage_ptr__->items = pVVar4;
        alignedFree((void *)0x0);
        psVar6 = &__return_storage_ptr__->size_alloced;
        *psVar12 = uVar13;
      }
      *psVar6 = uVar13;
      sVar11 = *psVar12;
      if (sVar11 != 0) {
        paVar5 = &__return_storage_ptr__->items->field_0;
        lVar10 = 0x90;
        do {
          local_48 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-2].ty +
                                           lVar10),true);
          local_58 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].ty +
                                           lVar10),true);
          fVar14 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ty +
                                         lVar10),true);
          aVar1.m128[1] = local_58;
          aVar1.m128[0] = local_48;
          aVar1.m128[2] = fVar14;
          aVar1.m128[3] = 0.0;
          *paVar5 = aVar1;
          lVar10 = lVar10 + 0xd8;
          paVar5 = paVar5 + 1;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
    }
    else {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                ((vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *)&local_98,
                 this,xml);
      psVar12 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fa *)0x0;
      lVar10 = (long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p) >> 2;
      sVar11 = lVar10 * -0x5555555555555555;
      if ((pointer)local_98._M_string_length != local_98._M_dataplus._M_p) {
        pVVar4 = (Vec3fa *)alignedMalloc(lVar10 * -0x5555555555555550,0x10);
        __return_storage_ptr__->items = pVVar4;
        alignedFree((void *)0x0);
        *psVar12 = sVar11;
        psVar12 = &__return_storage_ptr__->size_alloced;
      }
      *psVar12 = sVar11;
      if ((pointer)local_98._M_string_length != local_98._M_dataplus._M_p) {
        paVar5 = &__return_storage_ptr__->items->field_0;
        lVar10 = 4;
        uVar9 = 0;
        do {
          VVar2.field_0.m128[1] = (float)(int)*(undefined8 *)(local_98._M_dataplus._M_p + lVar10);
          VVar2.field_0.m128[0] = (float)*(undefined4 *)(local_98._M_dataplus._M_p + lVar10 + -4);
          VVar2.field_0.m128[2] =
               (float)(int)((ulong)*(undefined8 *)(local_98._M_dataplus._M_p + lVar10) >> 0x20);
          VVar2.field_0.m128[3] = 0.0;
          *paVar5 = VVar2.field_0;
          uVar9 = uVar9 + 1;
          paVar5 = paVar5 + 1;
          lVar10 = lVar10 + 0xc;
        } while (uVar9 < (ulong)(((long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p
                                        ) >> 2) * -0x5555555555555555));
      }
      if (local_98._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3fa> XMLLoader::loadVec3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3fa>();

    if (xml->parm("ofs") != "") {
      std::vector<Vec3f> temp = loadBinary<std::vector<Vec3f>>(xml);
      avector<Vec3fa> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = Vec3fa(temp[i]);
      return data;
    } 
    else 
    {
      avector<Vec3fa> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3fa(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }